

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spherical_quadrature.hpp
# Opt level: O0

tuple<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
* IntegratorXX::
  quadrature_traits<IntegratorXX::SphericalQuadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MuraKnowlesRadialTraits>,_IntegratorXX::Womersley<double>_>,_void>
  ::generate(tuple<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
             *__return_storage_ptr__,
            Quadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MuraKnowlesRadialTraits>_>
            *r,Quadrature<IntegratorXX::Womersley<double>_> *a,point_type *cen)

{
  double dVar1;
  double dVar2;
  __tuple_element_t<0UL,_tuple<vector<array<double,_3UL>,_allocator<array<double,_3UL>_>_>,_vector<double,_allocator<double>_>_>_>
  *points_00;
  __tuple_element_t<1UL,_tuple<vector<array<double,_3UL>,_allocator<array<double,_3UL>_>_>,_vector<double,_allocator<double>_>_>_>
  *__args_1;
  size_t sVar3;
  size_t sVar4;
  point_container *this;
  const_reference pvVar5;
  reference pvVar6;
  size_t ij;
  size_t i;
  size_t j;
  point_container *rp;
  size_t npa;
  size_t npr;
  type *weights;
  type *points;
  point_type *local_28;
  point_type *cen_local;
  Quadrature<IntegratorXX::Womersley<double>_> *a_local;
  Quadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MuraKnowlesRadialTraits>_>
  *r_local;
  
  local_28 = cen;
  cen_local = (point_type *)a;
  a_local = (Quadrature<IntegratorXX::Womersley<double>_> *)r;
  r_local = (Quadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MuraKnowlesRadialTraits>_>
             *)__return_storage_ptr__;
  quadrature_traits<IntegratorXX::ProductQuadrature<IntegratorXX::detail::spherical_combine_op<double>,_IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MuraKnowlesRadialTraits>,_IntegratorXX::Womersley<double>_>,_void>
  ::generate((tuple<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
              *)&points,r,a);
  points_00 = std::
              get<0ul,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
                        ((tuple<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
                          *)&points);
  __args_1 = std::
             get<1ul,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
                       ((tuple<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
                         *)&points);
  sVar3 = QuadratureBase<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
          ::npts((QuadratureBase<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
                  *)a_local);
  sVar4 = QuadratureBase<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
          ::npts((QuadratureBase<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
                  *)cen_local);
  this = QuadratureBase<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
         ::points((QuadratureBase<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
                   *)a_local);
  for (i = 0; i < sVar4; i = i + 1) {
    for (ij = 0; ij < sVar3; ij = ij + 1) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](this,ij);
      dVar1 = *pvVar5;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](this,ij);
      dVar2 = *pvVar5;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](__args_1,ij + i * sVar3);
      *pvVar6 = dVar1 * dVar2 * *pvVar6;
    }
  }
  shift_grid(points_00,(point_type)*&local_28->_M_elems);
  std::
  make_tuple<std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>&,std::vector<double,std::allocator<double>>&>
            (__return_storage_ptr__,points_00,__args_1);
  std::
  tuple<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
  ::~tuple((tuple<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
            *)&points);
  return __return_storage_ptr__;
}

Assistant:

inline static std::tuple<point_container,weight_container>
    generate( 
      const Quadrature<RadialQuad>&  r, 
      const Quadrature<AngularQuad>& a,
      const point_type&              cen
    ) {

    auto [points, weights] = prod_traits::generate(r, a); 

    const auto npr  = r.npts();
    const auto npa  = a.npts();

    const auto& rp = r.points();

    // Include Spherical Jacobian
    for( size_t j = 0; j < npa; ++j )
    for( size_t i = 0; i < npr; ++i ) {

      const auto ij = i + j * npr;
      weights[ij] *= rp[i] * rp[i];

    }

    // Recenter
    shift_grid( points, cen );

    return std::make_tuple( points, weights );

  }